

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O1

_Bool observe_kill_move(wchar_t y,wchar_t x,wchar_t d,uint8_t a,wchar_t c,_Bool flag)

{
  ushort uVar1;
  short sVar2;
  wchar_t x_00;
  wchar_t y_00;
  int iVar3;
  int iVar4;
  bool bVar5;
  chunk_conflict *c_00;
  monster_race *pmVar6;
  borg_kill *pbVar7;
  _Bool _Var8;
  wchar_t wVar9;
  uint uVar10;
  loc grid;
  monster *pmVar11;
  char *pcVar12;
  wchar_t y_01;
  _Bool multi;
  long lVar13;
  bitflag *flags;
  wchar_t x_01;
  bool bVar14;
  uint8_t *puVar15;
  long lVar16;
  uint8_t *local_68;
  
  bVar14 = 1 < borg_kills_nxt;
  if (1 < borg_kills_nxt) {
    lVar13 = 1;
    lVar16 = 0x1d8;
    local_68._0_4_ = d;
    do {
      pbVar7 = borg_kills;
      if ((*(short *)(borg_kills->spell + lVar16 + -0x19) != 0) &&
         (borg_kills->spell[lVar16 + -0x10] == '\0')) {
        x_00 = *(wchar_t *)(borg_kills->spell + lVar16 + -0xd);
        y_00 = *(wchar_t *)(borg_kills->spell + lVar16 + -9);
        wVar9 = borg_distance(y_00,x_00,y,x);
        pmVar6 = r_info;
        uVar1 = *(ushort *)(pbVar7->spell + lVar16 + -0x19);
        flags = r_info[uVar1].flags;
        _Var8 = flag_has_dbg(flags,0xb,1,"r_ptr->flags","RF_UNIQUE");
        c_00 = cave;
        local_68._0_4_ = (wchar_t)local_68 << _Var8;
        if (wVar9 <= (wchar_t)local_68) {
          sVar2 = *(short *)((long)&pbVar7->m_idx + lVar16);
          grid = (loc)loc(x,y);
          pmVar11 = square_monster(c_00,grid);
          if (((pmVar11->midx == (int)sVar2) &&
              ((flag || (wVar9 <= (int)(uint)(byte)(pbVar7->spell[lVar16 + -2] / 10 + 1))))) &&
             ((borg.trait[0x78] != 0 || (pmVar6[uVar1].d_char == c)))) {
            if (((borg.trait[0x78] != 0) || (pmVar6[uVar1].d_attr != a)) &&
               (_Var8 = flag_has_dbg(flags,0xb,10,"r_ptr->flags","RF_ATTR_MULTI"), !_Var8)) {
              y_01 = L'\x0028501b';
              x_01 = L'\x0027e2aa';
              _Var8 = flag_has_dbg(flags,0xb,9,"r_ptr->flags","RF_ATTR_CLEAR");
              if (!_Var8) {
                if (((flag) && (pbVar7->spell[lVar16 + -0x17] == '\0')) &&
                   (uVar10 = borg_guess_race((uint8_t)y,x,multi,y_01,x_01), uVar10 != 0)) {
                  pcVar12 = format("# Flickering monster \'%s\' at (%d,%d)",r_info[uVar10].name,
                                   (ulong)(uint)y,(ulong)(uint)x);
                  borg_note(pcVar12);
                  uVar1 = *(ushort *)(pbVar7->spell + lVar16 + -0x19);
                  if (uVar1 == 0) {
                    pcVar12 = "dead monster";
                  }
                  else if ((int)(uint)uVar1 < (int)(z_info->r_max - 1)) {
                    pcVar12 = r_info[(uint)uVar1].name;
                  }
                  else {
                    pcVar12 = "player ghost";
                  }
                  puVar15 = pbVar7->spell + lVar16 + -9;
                  pcVar12 = format("# Converting a monster \'%s\' at (%d,%d)",pcVar12,
                                   (ulong)*(uint *)puVar15,(ulong)*(uint *)(puVar15 + -4));
                  borg_note(pcVar12);
                  *(short *)(puVar15 + -0x10) = (short)uVar10;
                  borg_danger_wipe = true;
                  borg.goal.type = 0;
                  bVar5 = true;
                  goto LAB_002197f5;
                }
                goto LAB_002197a4;
              }
            }
            puVar15 = pbVar7->spell + lVar16 + -9;
            bVar5 = false;
LAB_002197f5:
            local_68 = pbVar7->spell + lVar16 + -0xd;
            if (wVar9 != L'\0') {
              iVar3 = *(int *)(pbVar7->spell + lVar16 + -9);
              iVar4 = *(int *)(pbVar7->spell + lVar16 + -0xd);
              borg_grids[iVar3][iVar4].kill = '\0';
              pbVar7->spell[lVar16 + -5] = (uint8_t)iVar4;
              pbVar7->spell[lVar16 + -4] = (uint8_t)iVar3;
              *(wchar_t *)(pbVar7->spell + lVar16 + -0xd) = x;
              *(wchar_t *)(pbVar7->spell + lVar16 + -9) = y;
              borg_grids[y][x].kill = (uint8_t)lVar13;
              uVar1 = *(ushort *)(pbVar7->spell + lVar16 + -0x19);
              if (uVar1 == 0) {
                pcVar12 = "dead monster";
              }
              else if ((int)(uint)uVar1 < (int)(z_info->r_max - 1)) {
                pcVar12 = r_info[(uint)uVar1].name;
              }
              else {
                pcVar12 = "player ghost";
              }
              pcVar12 = format("# Tracking a monster \'%s\' at (%d,%d) from (%d,%d)",pcVar12,
                               (ulong)(uint)y,(ulong)(uint)x,(ulong)(uint)y_00,(ulong)(uint)x_00);
              borg_note(pcVar12);
              borg_danger_wipe = true;
              if ((((borg.goal.type == 1 && borg.trait[0x25] == 0) &&
                   (*(uint *)puVar15 == (uint)borg_flow_y[0])) &&
                  (*(uint *)local_68 == (uint)borg_flow_x[0])) ||
                 ((borg.goal.type == 2 && (borg.munchkin_mode == true)))) {
                borg.goal.type = 0;
              }
            }
            *(int16_t *)((long)&pbVar7->when + lVar16) = borg_t;
            if (borg_morgoth_id == *(ushort *)(pbVar7->spell + lVar16 + -0x19)) {
              borg_t_morgoth = borg_t;
            }
            if (bVar5) {
              borg_update_kill_new((wchar_t)lVar13);
            }
            borg_update_kill_old((wchar_t)lVar13);
            pbVar7->spell[lVar16 + -0x10] = '\x01';
            return bVar14;
          }
        }
      }
LAB_002197a4:
      lVar13 = lVar13 + 1;
      lVar16 = lVar16 + 0x1d8;
      bVar14 = lVar13 < borg_kills_nxt;
    } while (lVar13 < borg_kills_nxt);
  }
  return bVar14;
}

Assistant:

bool observe_kill_move(int y, int x, int d, uint8_t a, wchar_t c, bool flag)
{
    int                  i, z, ox, oy;
    unsigned int         r_idx;
    borg_kill           *kill;
    struct monster_race *r_ptr;

    bool flicker = false;

    /* Look at the monsters */
    for (i = 1; i < borg_kills_nxt; i++) {
        kill = &borg_kills[i];

        /* Skip dead monsters */
        if (!kill->r_idx)
            continue;

        /* Skip assigned monsters */
        if (kill->seen)
            continue;

        /* Old location */
        ox = kill->pos.x;
        oy = kill->pos.y;

        /* Calculate distance */
        z = borg_distance(oy, ox, y, x);

        /* Access the monster race */
        r_ptr = &r_info[kill->r_idx];

        /* Double the distance for uniques so the borg does not create 2 of the
         * same unique monster on the level */
        if (rf_has(r_ptr->flags, RF_UNIQUE))
            d = d * 2;

        /* Verify distance */
        if (z > d)
            continue;

        /* Verify that we are looking at the right one */
        if (kill->m_idx != square_monster(cave, loc(x, y))->midx)
            continue;

        /* Verify "reasonable" motion, if allowed */
        if (!flag && (z > (kill->moves / 10) + 1))
            continue;

        /* Verify matching char so long as not hallucinating */
        if (!borg.trait[BI_ISIMAGE] && c != r_ptr->d_char)
            continue;

        /* Verify matching attr so long as not hallucinating */
        if (a != r_ptr->d_attr || borg.trait[BI_ISIMAGE]) {
            /* Require matching attr (for normal monsters) */
            if (!rf_has(r_ptr->flags, RF_ATTR_MULTI)
                && !rf_has(r_ptr->flags, RF_ATTR_CLEAR)) {
                /* Require flag */
                if (!flag)
                    continue;

                /* Never flicker known monsters */
                if (kill->known)
                    continue;

                /* Find a multi-hued monster */
                r_idx = borg_guess_race(a, c, true, y, x);

                /* Handle failure */
                if (!r_idx)
                    continue;

                /* Note */
                borg_note(format("# Flickering monster '%s' at (%d,%d)",
                    (r_info[r_idx].name), y, x));

                /* Note */
                borg_note(format("# Converting a monster '%s' at (%d,%d)",
                    borg_race_name(kill->r_idx), kill->pos.y, kill->pos.x));

                /* Change the race */
                kill->r_idx = r_idx;

                /* Monster flickers */
                flicker = true;

                /* Recalculate danger */
                borg_danger_wipe = true;

                /* Clear monster flow goals */
                borg.goal.type = 0;
            }
        }

        /* Actual movement */
        if (z) {

            /* Update the grids */
            borg_grids[kill->pos.y][kill->pos.x].kill = 0;

            /* Save the old Location */
            kill->ox = kill->pos.x;
            kill->oy = kill->pos.y;

            /* Save the Location */
            kill->pos.x = x;
            kill->pos.y = y;

            /* Update the grids */
            borg_grids[kill->pos.y][kill->pos.x].kill = i;

            /* Note */
            borg_note(
                format("# Tracking a monster '%s' at (%d,%d) from (%d,%d)",
                    borg_race_name(kill->r_idx), kill->pos.y, kill->pos.x, oy, ox));

            /* Recalculate danger */
            borg_danger_wipe = true;

            /* Clear goals */
            if ((!borg.trait[BI_ESP] && borg.goal.type == GOAL_KILL
                    && (borg_flow_y[0] == kill->pos.y
                        && borg_flow_x[0] == kill->pos.x))
                || (borg.goal.type == GOAL_TAKE && borg.munchkin_mode))
                borg.goal.type = 0;
        }

        /* Note when last seen */
        kill->when = borg_t;

        /* Mark the Morgoth time stamp if needed */
        if (kill->r_idx == borg_morgoth_id)
            borg_t_morgoth = borg_t;

        /* Monster flickered */
        if (flicker) {
            /* Update the monster */
            borg_update_kill_new(i);
        }

        /* Update the monster */
        borg_update_kill_old(i);

        /* Mark as seen */
        kill->seen = true;

        /* Done */
        return true;
    }

    /* Oops */
    return false;
}